

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O3

REF_STATUS ref_iso_ghost(REF_GRID_conflict iso_grid,REF_EDGE ref_edge,REF_INT *new_node)

{
  uint uVar1;
  REF_MPI pRVar2;
  REF_NODE pRVar3;
  REF_DBL *pRVar4;
  undefined1 auVar5 [16];
  REF_GRID_conflict pRVar6;
  uint uVar7;
  int iVar8;
  REF_GLOB *__s;
  REF_INT *__s_00;
  REF_DBL *data;
  ulong uVar9;
  long lVar10;
  undefined8 uVar11;
  REF_DBL *pRVar12;
  char *pcVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  REF_INT node;
  REF_INT part;
  uint local_64;
  REF_INT *local_60;
  REF_GLOB *local_58;
  int local_4c;
  REF_GRID_conflict local_48;
  REF_MPI local_40;
  REF_INT *local_38;
  
  iVar8 = ref_edge->n;
  lVar14 = (long)iVar8;
  local_38 = new_node;
  if (lVar14 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x29,
           "ref_iso_ghost","malloc edge_global of REF_GLOB negative");
    return 1;
  }
  pRVar2 = iso_grid->mpi;
  __s = (REF_GLOB *)malloc(lVar14 * 8);
  if (__s == (REF_GLOB *)0x0) {
    pcVar13 = "malloc edge_global of REF_GLOB NULL";
    uVar11 = 0x29;
    goto LAB_0019bf1b;
  }
  local_40 = pRVar2;
  if (iVar8 == 0) {
    __s_00 = (REF_INT *)malloc(0);
    if (__s_00 == (REF_INT *)0x0) goto LAB_0019bed7;
  }
  else {
    memset(__s,0xff,lVar14 * 8);
    __s_00 = (REF_INT *)malloc(lVar14 * 4);
    if (__s_00 == (REF_INT *)0x0) {
LAB_0019bed7:
      pcVar13 = "malloc edge_part of REF_INT NULL";
      uVar11 = 0x2a;
      goto LAB_0019bf1b;
    }
    memset(__s_00,0xff,lVar14 * 4);
  }
  uVar1 = iVar8 * 0xf;
  local_60 = __s_00;
  data = (REF_DBL *)malloc((ulong)uVar1 * 8);
  auVar5 = _DAT_00221120;
  if (data != (REF_DBL *)0x0) {
    local_58 = __s;
    local_48 = iso_grid;
    if (iVar8 != 0) {
      lVar14 = (ulong)uVar1 - 1;
      auVar15._8_4_ = (int)lVar14;
      auVar15._0_8_ = lVar14;
      auVar15._12_4_ = (int)((ulong)lVar14 >> 0x20);
      uVar9 = 0;
      auVar15 = auVar15 ^ _DAT_00221120;
      auVar16 = _DAT_00221110;
      do {
        auVar17 = auVar16 ^ auVar5;
        if ((bool)(~(auVar17._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar17._0_4_ ||
                    auVar15._4_4_ < auVar17._4_4_) & 1)) {
          data[uVar9] = -999.0;
        }
        if ((auVar17._12_4_ != auVar15._12_4_ || auVar17._8_4_ <= auVar15._8_4_) &&
            auVar17._12_4_ <= auVar15._12_4_) {
          data[uVar9 + 1] = -999.0;
        }
        uVar9 = uVar9 + 2;
        lVar14 = auVar16._8_8_;
        auVar16._0_8_ = auVar16._0_8_ + 2;
        auVar16._8_8_ = lVar14 + 2;
      } while ((uVar1 + 1 & 0xfffffffe) != uVar9);
      lVar14 = 0;
      pRVar12 = data;
      do {
        uVar1 = local_38[lVar14];
        local_64 = uVar1;
        if ((ulong)uVar1 != 0xffffffff) {
          uVar7 = ref_edge_part(ref_edge,(REF_INT)lVar14,&local_4c);
          if (uVar7 != 0) {
            pcVar13 = "edge part";
            uVar11 = 0x31;
            goto LAB_0019bfc8;
          }
          if (local_40->id == local_4c) {
            pRVar3 = local_48->node;
            lVar10 = -1;
            if (((-1 < (int)uVar1) && ((int)uVar1 < pRVar3->max)) &&
               (lVar10 = pRVar3->global[uVar1], lVar10 < 0)) {
              lVar10 = -1;
            }
            local_58[lVar14] = lVar10;
            local_60[lVar14] = pRVar3->part[(int)uVar1];
            pRVar4 = pRVar3->real;
            lVar10 = 0;
            do {
              pRVar12[lVar10] = pRVar4[(long)(int)uVar1 * 0xf + lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar10 != 0xf);
          }
        }
        lVar14 = lVar14 + 1;
        pRVar12 = pRVar12 + 0xf;
      } while (lVar14 < ref_edge->n);
    }
    pRVar2 = local_40;
    uVar7 = ref_edge_ghost_glob(ref_edge,local_40,local_58);
    if (uVar7 == 0) {
      uVar7 = ref_edge_ghost_int(ref_edge,pRVar2,local_60);
      if (uVar7 == 0) {
        uVar7 = ref_edge_ghost_dbl(ref_edge,pRVar2,data,0xf);
        pRVar6 = local_48;
        if (uVar7 == 0) {
          iVar8 = ref_edge->n;
          if (0 < iVar8) {
            lVar14 = 0;
            pRVar12 = data;
            do {
              if (local_58[lVar14] != -1) {
                uVar7 = ref_node_add(pRVar6->node,local_58[lVar14],(REF_INT *)&local_64);
                if (uVar7 != 0) {
                  pcVar13 = "add node";
                  uVar11 = 0x45;
                  goto LAB_0019bfc8;
                }
                local_38[lVar14] = local_64;
                pRVar3 = pRVar6->node;
                pRVar3->part[(int)local_64] = local_60[lVar14];
                pRVar4 = pRVar3->real;
                lVar10 = 0;
                do {
                  pRVar4[(long)(int)local_64 * 0xf + lVar10] = pRVar12[lVar10];
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 0xf);
                iVar8 = ref_edge->n;
              }
              lVar14 = lVar14 + 1;
              pRVar12 = pRVar12 + 0xf;
            } while (lVar14 < iVar8);
          }
          free(data);
          free(local_60);
          free(local_58);
          return 0;
        }
        pcVar13 = "xyz ghost";
        uVar11 = 0x3f;
      }
      else {
        pcVar13 = "part ghost";
        uVar11 = 0x3d;
      }
    }
    else {
      pcVar13 = "global ghost";
      uVar11 = 0x3c;
    }
LAB_0019bfc8:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",uVar11,
           "ref_iso_ghost",(ulong)uVar7,pcVar13);
    return uVar7;
  }
  pcVar13 = "malloc edge_real of REF_DBL NULL";
  uVar11 = 0x2c;
LAB_0019bf1b:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",uVar11,
         "ref_iso_ghost",pcVar13);
  return 2;
}

Assistant:

REF_FCN static REF_STATUS ref_iso_ghost(REF_GRID iso_grid, REF_EDGE ref_edge,
                                        REF_INT *new_node) {
  REF_MPI ref_mpi = ref_grid_mpi(iso_grid);
  REF_GLOB *edge_global;
  REF_INT *edge_part;
  REF_DBL *edge_real;
  REF_INT edge, node, part, i;
  REF_GLOB global;

  ref_malloc_init(edge_global, ref_edge_n(ref_edge), REF_GLOB, REF_EMPTY);
  ref_malloc_init(edge_part, ref_edge_n(ref_edge), REF_INT, REF_EMPTY);
  ref_malloc_init(edge_real, REF_NODE_REAL_PER * ref_edge_n(ref_edge), REF_DBL,
                  -999.0);

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node = new_node[edge];
    if (REF_EMPTY != node) {
      RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
      if (ref_mpi_rank(ref_mpi) == part) {
        edge_global[edge] = ref_node_global(ref_grid_node(iso_grid), node);
        edge_part[edge] = ref_node_part(ref_grid_node(iso_grid), node);
        for (i = 0; i < REF_NODE_REAL_PER; i++)
          edge_real[i + REF_NODE_REAL_PER * edge] =
              ref_node_real(ref_grid_node(iso_grid), i, node);
      }
    }
  }

  RSS(ref_edge_ghost_glob(ref_edge, ref_mpi, edge_global), "global ghost");
  RSS(ref_edge_ghost_int(ref_edge, ref_mpi, edge_part), "part ghost");
  RSS(ref_edge_ghost_dbl(ref_edge, ref_mpi, edge_real, REF_NODE_REAL_PER),
      "xyz ghost");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    global = edge_global[edge];
    if (REF_EMPTY != global) {
      /* finds local if already inserted */
      RSS(ref_node_add(ref_grid_node(iso_grid), global, &node), "add node");
      new_node[edge] = node;
      ref_node_part(ref_grid_node(iso_grid), node) = edge_part[edge];
      for (i = 0; i < REF_NODE_REAL_PER; i++)
        ref_node_real(ref_grid_node(iso_grid), i, node) =
            edge_real[i + REF_NODE_REAL_PER * edge];
    }
  }

  ref_free(edge_real);
  ref_free(edge_part);
  ref_free(edge_global);

  return REF_SUCCESS;
}